

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

optional<long> __thiscall
wallet::LegacyScriptPubKeyMan::GetOldestKeyPoolTime(LegacyScriptPubKeyMan *this)

{
  WalletStorage *pWVar1;
  int iVar2;
  undefined4 extraout_var;
  _Storage<long,_true> _Var4;
  _Storage<long,_true> _Var5;
  undefined8 extraout_RDX;
  pointer *__ptr;
  long in_FS_OFFSET;
  optional<long> oVar6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  WalletBatch local_38;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  WalletDatabase *pWVar3;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
  (*pWVar3->_vptr_WalletDatabase[0xe])(&local_38,pWVar3,1);
  local_38.m_database = pWVar3;
  _Var4._M_value =
       GetOldestKeyTimeInPool(&(this->super_LegacyDataSPKM).setExternalKeyPool,&local_38);
  iVar2 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])(this);
  if ((char)iVar2 != '\0') {
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar2 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,0x2227c);
    if ((char)iVar2 != '\0') {
      _Var5._M_value =
           GetOldestKeyTimeInPool(&(this->super_LegacyDataSPKM).setInternalKeyPool,&local_38);
      if (_Var4._M_value < _Var5._M_value) {
        _Var4._M_value = _Var5._M_value;
      }
      if ((this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
          _M_node_count != 0) {
        _Var5._M_value =
             GetOldestKeyTimeInPool(&(this->super_LegacyDataSPKM).set_pre_split_keypool,&local_38);
        if (_Var4._M_value < _Var5._M_value) {
          _Var4._M_value = _Var5._M_value;
        }
      }
    }
  }
  if ((tuple<wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
      local_38.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_38.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)extraout_RDX >> 8);
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var4._M_value;
    return (optional<long>)
           oVar6.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> LegacyScriptPubKeyMan::GetOldestKeyPoolTime() const
{
    LOCK(cs_KeyStore);

    WalletBatch batch(m_storage.GetDatabase());

    // load oldest key from keypool, get time and return
    int64_t oldestKey = GetOldestKeyTimeInPool(setExternalKeyPool, batch);
    if (IsHDEnabled() && m_storage.CanSupportFeature(FEATURE_HD_SPLIT)) {
        oldestKey = std::max(GetOldestKeyTimeInPool(setInternalKeyPool, batch), oldestKey);
        if (!set_pre_split_keypool.empty()) {
            oldestKey = std::max(GetOldestKeyTimeInPool(set_pre_split_keypool, batch), oldestKey);
        }
    }

    return oldestKey;
}